

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

bool __thiscall CProficiencies::InterpCommand(CProficiencies *this,char *command,char *argument)

{
  code *pcVar1;
  char *profname;
  ushort uVar2;
  long lVar3;
  long lVar4;
  CProficiencies *pCVar5;
  long lVar6;
  char_data *pcVar7;
  bool bVar8;
  allocator<char> local_69;
  CProficiencies *local_68;
  char *local_60;
  char *local_58;
  string local_50 [32];
  
  if (*command != '\0') {
    lVar3 = ((long)prof_cmd_table.super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)prof_cmd_table.super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18;
    lVar6 = 0x10;
    local_68 = this;
    local_60 = argument;
    local_58 = command;
    while (bVar8 = lVar3 != 0, lVar3 = lVar3 + -1, bVar8) {
      pcVar1 = *(code **)((long)prof_cmd_table.
                                super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar6 + -8);
      profname = *(char **)((long)&(prof_cmd_table.
                                    super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->name + lVar6);
      std::__cxx11::string::string<std::allocator<char>>
                (local_50,*(char **)((long)prof_cmd_table.
                                           super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x10
                                    ),&local_69);
      lVar4 = std::__cxx11::string::find((char *)local_50,(ulong)local_58);
      std::__cxx11::string::~string(local_50);
      if (lVar4 != -1) {
        uVar2 = ProfIndexLookup(profname);
        if ((profname == "none") || (uVar2 == 0xffff)) {
          pcVar7 = local_68->ch;
LAB_003b2f2d:
          (*pcVar1)(pcVar7,local_60);
          return true;
        }
        if (uVar2 < 0x19) {
          pcVar7 = local_68->ch;
          if (pcVar7->pcdata == (PC_DATA *)0x0) {
            pCVar5 = &prof_none;
          }
          else {
            pCVar5 = &pcVar7->pcdata->profs;
          }
          if (-1 < pCVar5->profs[uVar2]) goto LAB_003b2f2d;
        }
      }
      lVar6 = lVar6 + 0x18;
    }
  }
  return false;
}

Assistant:

bool CProficiencies::InterpCommand(char *command, char *argument)
{
	if (strlen(command) == 0)
		return false;

	auto prof_cmd_table_size = std::size(prof_cmd_table);
	for (auto i = 0; i < prof_cmd_table_size; i++)
	{
		auto cmd = prof_cmd_table[i];
		auto foundPos = std::string(cmd.name).find(command);
		if (foundPos == std::string::npos)
			continue;
		
		auto pindex = ProfIndexLookup(cmd.requires);
		if (cmd.requires == "none" || pindex == -1 || ch->Profs()->HasProf(pindex))
		{
			(cmd.cmd) (ch, argument);
			return true;
		}
	}
			
	return false;
}